

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-compress.c
# Opt level: O3

void KosinskiCompress(KosinskiCompressCallbacks *callbacks,cc_bool print_debug_messages)

{
  byte *pbVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  ulong local_48;
  ulong local_38;
  
  uVar13 = 0;
  output_position = 0;
  match_buffer_index = 0;
  descriptor_bits_remaining = 0x10;
  do {
    uVar3 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
    if (uVar3 == 0xffffffff) {
      memset(ring_buffer + uVar13,0,0x20fc - uVar13);
      if (uVar13 == 0) goto LAB_00101937;
      goto LAB_0010151d;
    }
    ring_buffer[uVar13] = (uchar)uVar3;
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0xfd);
  memset(ring_buffer + 0xfd,0,0x1fff);
  uVar13 = 0xfd;
LAB_0010151d:
  uVar8 = 0;
  local_48 = 0;
  do {
    uVar3 = (uint)uVar8;
    if (uVar8 == 0) {
      uVar11 = 0;
      uVar12 = 0;
    }
    else {
      uVar6 = 0x1f03;
      if (uVar8 < 0x1f03) {
        uVar6 = uVar8;
      }
      uVar12 = 0;
      uVar11 = 0;
      uVar5 = 1;
      uVar7 = uVar3;
      do {
        uVar7 = uVar7 + 0x1fff & 0x1fff;
        uVar9 = 0;
        do {
          if (ring_buffer[(uVar3 & 0x1fff) + uVar9] != ring_buffer[uVar7 + uVar9])
          goto LAB_00101587;
          uVar9 = uVar9 + 1;
        } while (uVar9 != 0xfd);
        uVar9 = 0xfd;
LAB_00101587:
        if (uVar12 < uVar9) {
          uVar12 = uVar9;
          uVar11 = uVar5;
        }
        bVar14 = uVar5 != uVar6;
        uVar5 = uVar5 + 1;
      } while (bVar14);
    }
    uVar6 = uVar13 - uVar8;
    if (uVar12 < uVar13 - uVar8) {
      uVar6 = uVar12;
    }
    if (0x9fff < local_48) {
      if (print_debug_messages != '\0') {
        KosinskiCompress_cold_1();
      }
      descriptor = descriptor >> 1;
      descriptor_bits_remaining = descriptor_bits_remaining - 1;
      if (descriptor_bits_remaining == 0) {
        FlushData(callbacks);
        descriptor_bits_remaining = 0x10;
        match_buffer_index = 0;
      }
      local_48 = local_48 + (local_48 / 5 & 0xffffffffffffe000) * -5;
      PutDescriptorBit('\x01',callbacks);
      (match_buffer + match_buffer_index)[0] = '\0';
      (match_buffer + match_buffer_index)[1] = 0xf0;
      lVar2 = match_buffer_index + 2;
      match_buffer_index = match_buffer_index + 3;
      match_buffer[lVar2] = '\x01';
    }
    bVar10 = (byte)uVar6;
    if (uVar11 < 0x100 && uVar6 - 2 < 4) {
      if (print_debug_messages != '\0') {
        KosinskiCompress_cold_5();
      }
      if (descriptor_bits_remaining - 1 == 0) {
        descriptor_bits_remaining = descriptor_bits_remaining - 1;
        descriptor = descriptor >> 1;
        FlushData(callbacks);
        descriptor = descriptor >> 1;
        match_buffer_index = 0;
        descriptor_bits_remaining = 0xf;
      }
      else {
        descriptor = descriptor >> 2;
        descriptor_bits_remaining = descriptor_bits_remaining - 2;
        if (descriptor_bits_remaining == 0) {
          FlushData(callbacks);
          descriptor_bits_remaining = 0x10;
          match_buffer_index = 0;
        }
      }
      PutDescriptorBit((byte)(bVar10 - 2) >> 1,callbacks);
      PutDescriptorBit(bVar10 & 1,callbacks);
      bVar10 = -(char)uVar11;
      sVar4 = match_buffer_index + 1;
    }
    else if (uVar6 - 3 < 7) {
      if (print_debug_messages != '\0') {
        KosinskiCompress_cold_4();
      }
      descriptor = descriptor >> 1;
      descriptor_bits_remaining = descriptor_bits_remaining - 1;
      if (descriptor_bits_remaining == 0) {
        FlushData(callbacks);
        descriptor_bits_remaining = 0x10;
        match_buffer_index = 0;
      }
      PutDescriptorBit('\x01',callbacks);
      match_buffer[match_buffer_index] = (uchar)-uVar11;
      bVar10 = bVar10 + 6 & 7 | (byte)(-uVar11 >> 5) & 0xf8;
      sVar4 = match_buffer_index + 2;
      match_buffer_index = match_buffer_index + 1;
    }
    else if (uVar6 < 3) {
      if (print_debug_messages == '\0') {
        uVar11 = (ulong)(uVar3 & 0x1fff);
      }
      else {
        KosinskiCompress_cold_2();
        uVar11 = local_38;
      }
      PutDescriptorBit('\x01',callbacks);
      bVar10 = ring_buffer[uVar11];
      sVar4 = match_buffer_index + 1;
      uVar6 = 1;
    }
    else {
      if (print_debug_messages != '\0') {
        KosinskiCompress_cold_3();
      }
      descriptor = descriptor >> 1;
      descriptor_bits_remaining = descriptor_bits_remaining - 1;
      if (descriptor_bits_remaining == 0) {
        FlushData(callbacks);
        descriptor_bits_remaining = 0x10;
        match_buffer_index = 0;
      }
      PutDescriptorBit('\x01',callbacks);
      match_buffer[match_buffer_index] = (uchar)-uVar11;
      match_buffer[match_buffer_index + 1] = (byte)(-uVar11 >> 5) & 0xf8;
      bVar10 = bVar10 - 1;
      sVar4 = match_buffer_index + 3;
      match_buffer_index = match_buffer_index + 2;
    }
    pbVar1 = match_buffer + match_buffer_index;
    match_buffer_index = sVar4;
    *pbVar1 = bVar10;
    uVar11 = uVar13 + uVar6;
    uVar12 = uVar6;
    do {
      uVar3 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
      uVar5 = uVar13;
      if (uVar3 == 0xffffffff) break;
      uVar5 = (ulong)((uint)uVar13 & 0x1fff);
      ring_buffer[uVar5] = (uchar)uVar3;
      if (uVar5 < 0xfc) {
        ring_buffer[uVar5 + 0x2000] = (uchar)uVar3;
      }
      uVar13 = uVar13 + 1;
      uVar12 = uVar12 - 1;
      uVar5 = uVar11;
    } while (uVar12 != 0);
    uVar8 = uVar8 + uVar6;
    local_48 = local_48 + uVar6;
    uVar13 = uVar5;
  } while (uVar8 != uVar5);
LAB_00101937:
  if (print_debug_messages != '\0') {
    KosinskiCompress_cold_6();
  }
  descriptor = descriptor >> 1;
  descriptor_bits_remaining = descriptor_bits_remaining - 1;
  if (descriptor_bits_remaining == 0) {
    FlushData(callbacks);
    descriptor_bits_remaining = 0x10;
    match_buffer_index = 0;
  }
  PutDescriptorBit('\x01',callbacks);
  (match_buffer + match_buffer_index)[0] = '\0';
  (match_buffer + match_buffer_index)[1] = 0xf0;
  lVar2 = match_buffer_index + 2;
  match_buffer_index = match_buffer_index + 3;
  match_buffer[lVar2] = '\0';
  FlushData(callbacks);
  while( true ) {
    sVar4 = output_position;
    output_position = output_position + 1;
    if ((sVar4 & 0xf) == 0) break;
    (*callbacks->write_byte)(callbacks->write_byte_user_data,0);
  }
  return;
}

Assistant:

void KosinskiCompress(const KosinskiCompressCallbacks* const callbacks, const cc_bool print_debug_messages)
{
	size_t write_index = 0;
	size_t read_index = 0;
	size_t dummy_counter = 0;

	output_position = 0;
	match_buffer_index = 0;
	descriptor_bits_remaining = TOTAL_DESCRIPTOR_BITS;

	/* Initialise the ring buffer with data from the file */
	for (; write_index < MAX_MATCH_LENGTH; ++write_index)
	{
		const unsigned int byte = callbacks->read_byte((void*)callbacks->read_byte_user_data);

		if (byte == (unsigned int)-1)
			break;

		ring_buffer[write_index] = byte;
	}

	/* Fill the remainder of the ring buffer with zero. We know that
	   the original Kosinski compressor did this because of Mistake 6. */
	memset(&ring_buffer[write_index], 0, sizeof(ring_buffer) - write_index);

	while (read_index != write_index)
	{
		size_t i;

		const size_t max_match_distance = CC_MIN(read_index, MAX_MATCH_DISTANCE);

		/* Search backwards for previous occurances of the current data */
		size_t longest_match_index = 0;
		size_t longest_match_length = 0;
		size_t backsearch_index;
		for (backsearch_index = 1; backsearch_index < max_match_distance + 1; ++backsearch_index)
		{
			/* Mistake 6: `match_length` always counts up to `MAX_MATCH_LENGTH`, even if it means reading
			   past the end of the file. Because the ring buffer isn't updated once the end of the file is
			   reached, this results in leftover values from earlier in the file being read instead.
			   This bug causes the final match in the file to sometimes ignore suitable nearby data in
			   favour of data earlier in the file, even if it means using a larger match type. This is
			   because the chosen data just so happened to be followed by the same pattern of bytes that
			   the buggy search read from the ring buffer, while the nearby data did not. */
			size_t match_length = 0;
			const unsigned char *current_data = &ring_buffer[read_index % SLIDING_WINDOW_SIZE];
			const unsigned char *previous_data = &ring_buffer[(read_index - backsearch_index) % SLIDING_WINDOW_SIZE];
			while (match_length < MAX_MATCH_LENGTH && *current_data++ == *previous_data++)
				++match_length;

			if (match_length > longest_match_length)
			{
				longest_match_index = backsearch_index;
				longest_match_length = match_length;
			}
		}

		/* If the match is longer than the remainder of the file, reduce it to the proper size. See Mistake 6 for more info. */
		longest_match_length = CC_MIN(longest_match_length, write_index - read_index);

		/* Mistake 5: This is completely pointless.
		   For some reason, the original compressor would insert a dummy match
		   before the first match that starts after 0xA000.
		   Perhaps this was intended for detecting corrupted data? Maybe the PC
		   Kosinski decompressor would expect this type of match to appear every
		   0xA000 bytes, and if it didn't, then it would bail and print an error
		   message to the user telling them that the compressed data is corrupt. */
		if (dummy_counter >= 0xA000)
		{
			dummy_counter %= 0xA000;

			if (print_debug_messages)
				fprintf(stderr, "%lX - 0xA000 boundary flag: %lX\n", GetOutputPosition(), (unsigned long)read_index);

			/* 0xA000 boundary match */
			PutDescriptorBit(cc_false, callbacks);
			PutDescriptorBit(cc_true, callbacks);
			PutMatchByte(0x00);
			PutMatchByte(0xF0);	/* Honestly, I have no idea why this isn't just 0. I guess it's so you can spot it in a hex editor? */
			PutMatchByte(0x01);
		}

		/* Select the optimal encoding for the current match */
		if (longest_match_length >= 2 && longest_match_length <= 5 && longest_match_index < 0x100) /* Mistake 3: This should be '<= 0x100' */
		{
			/* Short distance, shortest length */
			const size_t length = longest_match_length - 2;

			if (print_debug_messages)
				fprintf(stderr, "%lX - Inline dictionary match found: %lX, %lX, %lX\n", GetOutputPosition(), (unsigned long)read_index, (unsigned long)(read_index - longest_match_index), (unsigned long)longest_match_length);

			PutDescriptorBit(cc_false, callbacks);
			PutDescriptorBit(cc_false, callbacks);
			PutDescriptorBit((length & 2) != 0, callbacks);
			PutDescriptorBit((length & 1) != 0, callbacks);
			PutMatchByte(-longest_match_index & 0xFF);
		}
		else if (longest_match_length >= 3 && longest_match_length <= 9)
		{
			/* Long distance, short length */
			const size_t distance = -longest_match_index;

			if (print_debug_messages)
				fprintf(stderr, "%lX - Full match found: %lX, %lX, %lX\n", GetOutputPosition(), (unsigned long)read_index, (unsigned long)(read_index - longest_match_index), (unsigned long)longest_match_length);

			PutDescriptorBit(cc_false, callbacks);
			PutDescriptorBit(cc_true, callbacks);
			PutMatchByte(distance & 0xFF);
			PutMatchByte(((distance >> (8 - 3)) & 0xF8) | ((longest_match_length - 2) & 7));
		}
		else if (longest_match_length >= 3)
		{
			/* Long distance, long length */
			const size_t distance = -longest_match_index;

			if (print_debug_messages)
				fprintf(stderr, "%lX - Extended full match found: %lX, %lX, %lX\n", GetOutputPosition(), (unsigned long)read_index, (unsigned long)(read_index - longest_match_index), (unsigned long)longest_match_length);

			PutDescriptorBit(cc_false, callbacks);
			PutDescriptorBit(cc_true, callbacks);
			PutMatchByte(distance & 0xFF);
			PutMatchByte((distance >> (8 - 3)) & 0xF8);
			PutMatchByte(longest_match_length - 1);
		}
		else
		{
			if (print_debug_messages)
				fprintf(stderr, "%lX - Literal match found: %X at %lX\n", GetOutputPosition(), ring_buffer[read_index % SLIDING_WINDOW_SIZE], (unsigned long)read_index);

			/* Match was too small to encode; do a literal match instead */
			longest_match_length = 1;

			PutDescriptorBit(cc_true, callbacks);
			PutMatchByte(ring_buffer[read_index % SLIDING_WINDOW_SIZE]);
		}

		/* Update the ring buffer with bytes from the file */
		for (i = 0; i < longest_match_length; ++i)
		{
			const unsigned int byte = callbacks->read_byte((void*)callbacks->read_byte_user_data);

			if (byte == (unsigned int)-1)
			{
				break;
			}
			else
			{
				const size_t ring_buffer_index = write_index++ % SLIDING_WINDOW_SIZE;

				ring_buffer[ring_buffer_index] = byte;

				/* Read into a little spill buffer, so that string comparisons
				   don't have to wrap back around to the start of the ring buffer */
				if (ring_buffer_index < MAX_MATCH_LENGTH - 1)
					ring_buffer[SLIDING_WINDOW_SIZE + ring_buffer_index] = byte;
			}
		}

		read_index += longest_match_length;
		dummy_counter += longest_match_length;
	}

	if (print_debug_messages)
		fprintf(stderr, "%lX - Terminator: %lX\n", GetOutputPosition(), (unsigned long)read_index);

	/* Terminator match */
	PutDescriptorBit(cc_false, callbacks);
	PutDescriptorBit(cc_true, callbacks);
	PutMatchByte(0x00);
	PutMatchByte(0xF0);	/* Honestly, I have no idea why this isn't just 0. I guess it's so you can spot it in a hex editor? */
	PutMatchByte(0x00);

	FlushData(callbacks);

	/* Mistake 4: There's absolutely no reason to do this.
	   This might have been because the original compressor's ASM output could
	   only write exactly 0x10 values per dc.b instruction. */

	/* Pad to 0x10 bytes */
	while (output_position++ % 0x10 != 0)
		callbacks->write_byte((void*)callbacks->write_byte_user_data, 0);
}